

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy.cpp
# Opt level: O1

bool fs_copy_file(string_view source,string_view dest,bool overwrite)

{
  string_view path;
  string_view path2;
  string_view path_00;
  string_view path1;
  int iVar1;
  bool bVar2;
  char cVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  undefined7 in_register_00000081;
  string_view fname;
  error_code ec;
  size_t in_stack_ffffffffffffff58;
  error_code local_80;
  path local_70;
  path local_48;
  
  pcVar4 = dest._M_str;
  pcVar5 = (char *)dest._M_len;
  pcVar6 = (char *)source._M_len;
  local_80._M_value = 0;
  local_80._M_cat = (error_category *)std::_V2::system_category();
  if ((((int)CONCAT71(in_register_00000081,overwrite) != 0) &&
      (path._M_str = pcVar5, path._M_len = in_stack_ffffffffffffff58, bVar2 = fs_is_file(path),
      bVar2)) &&
     (path_00._M_str = pcVar6, path_00._M_len = (size_t)pcVar4, bVar2 = fs_remove(path_00), !bVar2))
  {
    fs_copy_file();
  }
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_48,(basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffff70,
             auto_format);
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_70,(basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffff60,
             auto_format);
  cVar3 = std::filesystem::copy_file
                    (&local_48,&local_70,(short)CONCAT71(in_register_00000081,overwrite) * 2,
                     &local_80);
  iVar1 = local_80._M_value;
  if (cVar3 == '\0') {
    std::filesystem::__cxx11::path::~path(&local_70);
    std::filesystem::__cxx11::path::~path(&local_48);
  }
  else {
    std::filesystem::__cxx11::path::~path(&local_70);
    std::filesystem::__cxx11::path::~path(&local_48);
    if (iVar1 == 0) {
      return true;
    }
  }
  path1._M_str = source._M_str;
  path1._M_len = (size_t)pcVar6;
  path2._M_str = pcVar4;
  path2._M_len = (size_t)pcVar5;
  fname._M_str = "fs_copy_file";
  fname._M_len = 0xc;
  fs_print_error(path1,path2,fname,&local_80);
  return false;
}

Assistant:

bool fs_copy_file(std::string_view source, std::string_view dest, bool overwrite)
{
  // copy a single file -- symlinks are followed

  std::error_code ec;

#ifdef HAVE_CXX_FILESYSTEM
  auto opt = std::filesystem::copy_options::none;
  if (overwrite)
    opt = std::filesystem::copy_options::overwrite_existing;
// WORKAROUND: Windows MinGW GCC 11..13, Intel oneAPI Linux: bug with overwrite_existing failing on overwrite

  if(overwrite && fs_is_file(dest) && !fs_remove(dest)) FFS_UNLIKELY
    fs_print_error(dest, __func__, std::make_error_code(std::errc::io_error));

  if(std::filesystem::copy_file(source, dest, opt, ec) && !ec) FFS_LIKELY
    return true;

#elif defined(_WIN32)
  DWORD opts = 0;
  if(!overwrite)
    opts |= COPY_FILE_FAIL_IF_EXISTS;

  // https://learn.microsoft.com/en-us/windows/win32/api/winbase/nf-winbase-copyfileexa
  // preserves source file attributes
  if(CopyFileExA(source.data(), dest.data(), nullptr, nullptr, FALSE, opts) != 0)
    return true;

#elif defined(HAVE_MACOS_COPYFILE)
  // https://developer.apple.com/library/archive/documentation/System/Conceptual/ManPages_iPhoneOS/man3/copyfile.3.html
  // preserves source file attributes
  auto opt = COPYFILE_ALL;
  if (!overwrite)
    opt |= COPYFILE_EXCL;

  if(copyfile(source.data(), dest.data(), nullptr, opt) == 0)
    return true;
#else

  if(fs_copy_file_range_or_loop(source, dest, overwrite)) FFS_LIKELY
    return true;

#endif

  fs_print_error(source, dest, __func__, ec);
  return false;

}